

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O0

void free_languages_metadata(MMDB_s *mmdb)

{
  ulong local_18;
  size_t i;
  MMDB_s *mmdb_local;
  
  if ((mmdb->metadata).languages.names != (char **)0x0) {
    for (local_18 = 0; local_18 < (mmdb->metadata).languages.count; local_18 = local_18 + 1) {
      free((mmdb->metadata).languages.names[local_18]);
      (mmdb->metadata).languages.names[local_18] = (char *)0x0;
    }
    free((mmdb->metadata).languages.names);
    (mmdb->metadata).languages.names = (char **)0x0;
  }
  return;
}

Assistant:

static void free_languages_metadata(MMDB_s *mmdb) {
    if (!mmdb->metadata.languages.names) {
        return;
    }

    for (size_t i = 0; i < mmdb->metadata.languages.count; i++) {
#if defined(__clang__)
// This is a const char * that we need to free, which isn't valid. However it
// would mean changing the public API to fix this.
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wcast-qual"
#endif
        FREE_AND_SET_NULL(mmdb->metadata.languages.names[i]);
#if defined(__clang__)
#pragma clang diagnostic pop
#endif
    }
    FREE_AND_SET_NULL(mmdb->metadata.languages.names);
}